

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O3

Result<int> * SighashFromStr(Result<int> *__return_storage_ptr__,string *sighash)

{
  undefined8 *puVar1;
  int iVar2;
  const_iterator cVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long *plVar6;
  long lVar7;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l;
  allocator_type local_292;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_291;
  size_type *local_290;
  size_type local_288;
  size_type local_280;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined1 *local_270;
  undefined8 local_268;
  undefined1 local_260;
  undefined7 uStack_25f;
  undefined8 uStack_258;
  undefined1 *local_250;
  undefined8 local_248;
  undefined1 local_240;
  undefined7 uStack_23f;
  undefined8 uStack_238;
  long *local_230;
  undefined8 local_228;
  undefined1 local_220;
  undefined7 uStack_21f;
  undefined8 uStack_218;
  uint *local_210;
  undefined8 local_208;
  uint local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  uint *local_1f0;
  undefined8 local_1e8;
  uint local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  uint *local_1d0;
  undefined8 local_1c8;
  uint local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  uint *local_1b0;
  undefined8 local_1a8;
  uint local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  uint *local_190;
  undefined8 local_188;
  uint local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_150;
  uint *local_128;
  undefined8 local_120;
  uint local_118 [2];
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  uint *local_100;
  undefined8 local_f8;
  uint local_f0 [2];
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_e0;
  uint *local_d8;
  undefined8 local_d0;
  uint local_c8 [2];
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  uint *local_b0;
  undefined8 local_a8;
  uint local_a0 [2];
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 local_90;
  uint *local_88;
  undefined8 local_80;
  uint local_78 [2];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  long *local_60;
  undefined8 local_58;
  long local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (SighashFromStr(std::__cxx11::string_const&)::map_sighash_values_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&SighashFromStr(std::__cxx11::string_const&)::
                                 map_sighash_values_abi_cxx11_);
    if (iVar2 != 0) {
      local_170 = &local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"DEFAULT","");
      local_150.first._M_dataplus._M_p = (pointer)&local_150.first.field_2;
      if (local_170 == &local_160) {
        local_150.first.field_2._8_4_ = local_160._8_4_;
        local_150.first.field_2._12_4_ = local_160._12_4_;
      }
      else {
        local_150.first._M_dataplus._M_p = (pointer)local_170;
      }
      local_150.first.field_2._M_allocated_capacity._4_4_ = local_160._M_allocated_capacity._4_4_;
      local_150.first.field_2._M_allocated_capacity._0_4_ = local_160._M_allocated_capacity._0_4_;
      local_150.first._M_string_length = local_168;
      local_170 = &local_160;
      local_168 = 0;
      local_160._M_allocated_capacity._0_4_ = local_160._M_allocated_capacity._0_4_ & 0xffffff00;
      local_150.second = 0;
      local_190 = &local_180;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"ALL","");
      local_128 = local_118;
      if (local_190 == &local_180) {
        uStack_110 = uStack_178;
        uStack_10c = uStack_174;
      }
      else {
        local_128 = local_190;
      }
      local_120 = local_188;
      local_190 = &local_180;
      local_188 = 0;
      local_180 = local_180 & 0xffffff00;
      local_108 = 1;
      local_1b0 = &local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"ALL|ANYONECANPAY","");
      local_100 = local_f0;
      if (local_1b0 == &local_1a0) {
        uStack_e8 = uStack_198;
        uStack_e4 = uStack_194;
      }
      else {
        local_100 = local_1b0;
      }
      local_f8 = local_1a8;
      local_1b0 = &local_1a0;
      local_1a8 = 0;
      local_1a0 = local_1a0 & 0xffffff00;
      local_e0 = 0x81;
      local_1d0 = &local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"NONE","");
      local_d8 = local_c8;
      if (local_1d0 == &local_1c0) {
        uStack_c0 = uStack_1b8;
        uStack_bc = uStack_1b4;
      }
      else {
        local_d8 = local_1d0;
      }
      local_d0 = local_1c8;
      local_1d0 = &local_1c0;
      local_1c8 = 0;
      local_1c0 = local_1c0 & 0xffffff00;
      local_b8 = 2;
      local_1f0 = &local_1e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"NONE|ANYONECANPAY","");
      local_b0 = local_a0;
      if (local_1f0 == &local_1e0) {
        uStack_98 = uStack_1d8;
        uStack_94 = uStack_1d4;
      }
      else {
        local_b0 = local_1f0;
      }
      local_a8 = local_1e8;
      local_1f0 = &local_1e0;
      local_1e8 = 0;
      local_1e0 = local_1e0 & 0xffffff00;
      local_90 = 0x82;
      local_210 = &local_200;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"SINGLE","");
      local_88 = local_78;
      if (local_210 == &local_200) {
        uStack_70 = uStack_1f8;
        uStack_6c = uStack_1f4;
      }
      else {
        local_88 = local_210;
      }
      local_80 = local_208;
      local_208 = 0;
      local_200 = local_200 & 0xffffff00;
      local_68 = 3;
      local_230 = (long *)&local_220;
      local_210 = &local_200;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"SINGLE|ANYONECANPAY","")
      ;
      plVar6 = &local_50;
      if (local_230 == (long *)&local_220) {
        uStack_48 = uStack_218;
        local_60 = plVar6;
      }
      else {
        local_60 = local_230;
      }
      local_58 = local_228;
      local_228 = 0;
      local_220 = 0;
      local_40 = 0x83;
      __l._M_len = 7;
      __l._M_array = &local_150;
      local_230 = (long *)&local_220;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::map(&SighashFromStr(std::__cxx11::string_const&)::map_sighash_values_abi_cxx11_,__l,
            &local_291,&local_292);
      lVar7 = -0x118;
      do {
        if (plVar6 != (long *)plVar6[-2]) {
          operator_delete((long *)plVar6[-2],*plVar6 + 1);
        }
        plVar6 = plVar6 + -5;
        lVar7 = lVar7 + 0x28;
      } while (lVar7 != 0);
      if (local_230 != (long *)&local_220) {
        operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
      }
      if (local_210 != &local_200) {
        operator_delete(local_210,CONCAT44(uStack_1fc,local_200) + 1);
      }
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0,CONCAT44(uStack_1dc,local_1e0) + 1);
      }
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0,CONCAT44(uStack_1bc,local_1c0) + 1);
      }
      if (local_1b0 != &local_1a0) {
        operator_delete(local_1b0,CONCAT44(uStack_19c,local_1a0) + 1);
      }
      if (local_190 != &local_180) {
        operator_delete(local_190,CONCAT44(uStack_17c,local_180) + 1);
      }
      if (local_170 != &local_160) {
        operator_delete(local_170,
                        CONCAT44(local_160._M_allocated_capacity._4_4_,
                                 local_160._M_allocated_capacity._0_4_) + 1);
      }
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::~map,&SighashFromStr(std::__cxx11::string_const&)::
                           map_sighash_values_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SighashFromStr(std::__cxx11::string_const&)::
                           map_sighash_values_abi_cxx11_);
    }
  }
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&SighashFromStr(std::__cxx11::string_const&)::map_sighash_values_abi_cxx11_._M_t,
                 sighash);
  if ((_Rb_tree_header *)cVar3._M_node ==
      &SighashFromStr(std::__cxx11::string_const&)::map_sighash_values_abi_cxx11_._M_t._M_impl.
       super__Rb_tree_header) {
    std::operator+(&local_150.first,"\'",sighash);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_150.first,"\' is not a valid sighash parameter.");
    local_290 = (size_type *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290 == paVar5) {
      local_280 = paVar5->_M_allocated_capacity;
      uStack_278 = *(undefined4 *)((long)&pbVar4->field_2 + 8);
      uStack_274 = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
      local_290 = &local_280;
    }
    else {
      local_280 = paVar5->_M_allocated_capacity;
    }
    local_288 = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    local_270 = &local_260;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_270,local_290,(pointer)(local_288 + (long)local_290));
    local_250 = &local_240;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_250,local_290,(pointer)(local_288 + (long)local_290));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
                     super__Move_assign_alias<bilingual_str,_int>.
                     super__Copy_assign_alias<bilingual_str,_int>.
                     super__Move_ctor_alias<bilingual_str,_int>.
                     super__Copy_ctor_alias<bilingual_str,_int>.
                     super__Variant_storage_alias<bilingual_str,_int> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
      super__Move_assign_alias<bilingual_str,_int>.super__Copy_assign_alias<bilingual_str,_int>.
      super__Move_ctor_alias<bilingual_str,_int>.super__Copy_ctor_alias<bilingual_str,_int>.
      super__Variant_storage_alias<bilingual_str,_int> = puVar1;
    if (local_270 == &local_260) {
      *puVar1 = CONCAT71(uStack_25f,local_260);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
               super__Move_assign_alias<bilingual_str,_int>.
               super__Copy_assign_alias<bilingual_str,_int>.
               super__Move_ctor_alias<bilingual_str,_int>.super__Copy_ctor_alias<bilingual_str,_int>
               .super__Variant_storage_alias<bilingual_str,_int> + 0x18) = uStack_258;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
        super__Move_assign_alias<bilingual_str,_int>.super__Copy_assign_alias<bilingual_str,_int>.
        super__Move_ctor_alias<bilingual_str,_int>.super__Copy_ctor_alias<bilingual_str,_int>.
        super__Variant_storage_alias<bilingual_str,_int> = local_270;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
                        super__Move_assign_alias<bilingual_str,_int>.
                        super__Copy_assign_alias<bilingual_str,_int>.
                        super__Move_ctor_alias<bilingual_str,_int>.
                        super__Copy_ctor_alias<bilingual_str,_int>.
                        super__Variant_storage_alias<bilingual_str,_int> + 0x10) =
           CONCAT71(uStack_25f,local_260);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
             super__Move_assign_alias<bilingual_str,_int>.
             super__Copy_assign_alias<bilingual_str,_int>.super__Move_ctor_alias<bilingual_str,_int>
             .super__Copy_ctor_alias<bilingual_str,_int>.
             super__Variant_storage_alias<bilingual_str,_int> + 8) = local_268;
    local_268 = 0;
    local_260 = 0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
                     super__Move_assign_alias<bilingual_str,_int>.
                     super__Copy_assign_alias<bilingual_str,_int>.
                     super__Move_ctor_alias<bilingual_str,_int>.
                     super__Copy_ctor_alias<bilingual_str,_int>.
                     super__Variant_storage_alias<bilingual_str,_int> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
             super__Move_assign_alias<bilingual_str,_int>.
             super__Copy_assign_alias<bilingual_str,_int>.super__Move_ctor_alias<bilingual_str,_int>
             .super__Copy_ctor_alias<bilingual_str,_int>.
             super__Variant_storage_alias<bilingual_str,_int> + 0x20) = puVar1;
    if (local_250 == &local_240) {
      *puVar1 = CONCAT71(uStack_23f,local_240);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
               super__Move_assign_alias<bilingual_str,_int>.
               super__Copy_assign_alias<bilingual_str,_int>.
               super__Move_ctor_alias<bilingual_str,_int>.super__Copy_ctor_alias<bilingual_str,_int>
               .super__Variant_storage_alias<bilingual_str,_int> + 0x38) = uStack_238;
    }
    else {
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
               super__Move_assign_alias<bilingual_str,_int>.
               super__Copy_assign_alias<bilingual_str,_int>.
               super__Move_ctor_alias<bilingual_str,_int>.super__Copy_ctor_alias<bilingual_str,_int>
               .super__Variant_storage_alias<bilingual_str,_int> + 0x20) = local_250;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
                        super__Move_assign_alias<bilingual_str,_int>.
                        super__Copy_assign_alias<bilingual_str,_int>.
                        super__Move_ctor_alias<bilingual_str,_int>.
                        super__Copy_ctor_alias<bilingual_str,_int>.
                        super__Variant_storage_alias<bilingual_str,_int> + 0x30) =
           CONCAT71(uStack_23f,local_240);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
             super__Move_assign_alias<bilingual_str,_int>.
             super__Copy_assign_alias<bilingual_str,_int>.super__Move_ctor_alias<bilingual_str,_int>
             .super__Copy_ctor_alias<bilingual_str,_int>.
             super__Variant_storage_alias<bilingual_str,_int> + 0x28) = local_248;
    local_248 = 0;
    local_240 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
             super__Move_assign_alias<bilingual_str,_int>.
             super__Copy_assign_alias<bilingual_str,_int>.super__Move_ctor_alias<bilingual_str,_int>
             .super__Copy_ctor_alias<bilingual_str,_int>.
             super__Variant_storage_alias<bilingual_str,_int> + 0x40) = '\0';
    local_270 = &local_260;
    local_250 = &local_240;
    if (local_290 != &local_280) {
      operator_delete(local_290,local_280 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.first._M_dataplus._M_p != &local_150.first.field_2) {
      operator_delete(local_150.first._M_dataplus._M_p,
                      local_150.first.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    *(_Rb_tree_color *)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
      super__Move_assign_alias<bilingual_str,_int>.super__Copy_assign_alias<bilingual_str,_int>.
      super__Move_ctor_alias<bilingual_str,_int>.super__Copy_ctor_alias<bilingual_str,_int>.
      super__Variant_storage_alias<bilingual_str,_int> = cVar3._M_node[2]._M_color;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
             super__Move_assign_alias<bilingual_str,_int>.
             super__Copy_assign_alias<bilingual_str,_int>.super__Move_ctor_alias<bilingual_str,_int>
             .super__Copy_ctor_alias<bilingual_str,_int>.
             super__Variant_storage_alias<bilingual_str,_int> + 0x40) = '\x01';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<int> SighashFromStr(const std::string& sighash)
{
    static const std::map<std::string, int> map_sighash_values = {
        {std::string("DEFAULT"), int(SIGHASH_DEFAULT)},
        {std::string("ALL"), int(SIGHASH_ALL)},
        {std::string("ALL|ANYONECANPAY"), int(SIGHASH_ALL|SIGHASH_ANYONECANPAY)},
        {std::string("NONE"), int(SIGHASH_NONE)},
        {std::string("NONE|ANYONECANPAY"), int(SIGHASH_NONE|SIGHASH_ANYONECANPAY)},
        {std::string("SINGLE"), int(SIGHASH_SINGLE)},
        {std::string("SINGLE|ANYONECANPAY"), int(SIGHASH_SINGLE|SIGHASH_ANYONECANPAY)},
    };
    const auto& it = map_sighash_values.find(sighash);
    if (it != map_sighash_values.end()) {
        return it->second;
    } else {
        return util::Error{Untranslated("'" + sighash + "' is not a valid sighash parameter.")};
    }
}